

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O0

int mbedtls_ctr_drbg_reseed(mbedtls_ctr_drbg_context *ctx,uchar *additional,size_t len)

{
  int iVar1;
  size_t local_1b0;
  size_t seedlen;
  uchar seed [384];
  size_t len_local;
  uchar *additional_local;
  mbedtls_ctr_drbg_context *ctx_local;
  
  if ((ctx->entropy_len < 0x181) && (len <= 0x180 - ctx->entropy_len)) {
    seed._376_8_ = len;
    memset(&seedlen,0,0x180);
    iVar1 = (*ctx->f_entropy)(ctx->p_entropy,(uchar *)&seedlen,ctx->entropy_len);
    if (iVar1 == 0) {
      local_1b0 = ctx->entropy_len;
      if ((additional != (uchar *)0x0) && (seed._376_8_ != 0)) {
        memcpy(seed + (local_1b0 - 8),additional,seed._376_8_);
        local_1b0 = seed._376_8_ + local_1b0;
      }
      block_cipher_df((uchar *)&seedlen,(uchar *)&seedlen,local_1b0);
      ctr_drbg_update_internal(ctx,(uchar *)&seedlen);
      ctx->reseed_counter = 1;
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ = -0x34;
    }
  }
  else {
    ctx_local._4_4_ = -0x38;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_ctr_drbg_reseed( mbedtls_ctr_drbg_context *ctx,
                     const unsigned char *additional, size_t len )
{
    unsigned char seed[MBEDTLS_CTR_DRBG_MAX_SEED_INPUT];
    size_t seedlen = 0;

    if( ctx->entropy_len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT ||
        len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT - ctx->entropy_len )
        return( MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG );

    memset( seed, 0, MBEDTLS_CTR_DRBG_MAX_SEED_INPUT );

    /*
     * Gather entropy_len bytes of entropy to seed state
     */
    if( 0 != ctx->f_entropy( ctx->p_entropy, seed,
                             ctx->entropy_len ) )
    {
        return( MBEDTLS_ERR_CTR_DRBG_ENTROPY_SOURCE_FAILED );
    }

    seedlen += ctx->entropy_len;

    /*
     * Add additional data
     */
    if( additional && len )
    {
        memcpy( seed + seedlen, additional, len );
        seedlen += len;
    }

    /*
     * Reduce to 384 bits
     */
    block_cipher_df( seed, seed, seedlen );

    /*
     * Update state
     */
    ctr_drbg_update_internal( ctx, seed );
    ctx->reseed_counter = 1;

    return( 0 );
}